

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit.cpp
# Opt level: O2

void __thiscall DriverTest_Glob_Test::TestBody(DriverTest_Glob_Test *this)

{
  char cVar1;
  bool bVar2;
  ParamType *pPVar3;
  long lVar4;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_02;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_03;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_04;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_05;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_06;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_07;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_689;
  allocator local_688;
  allocator local_687;
  allocator local_686;
  allocator_type local_685;
  allocator local_684;
  allocator local_683;
  allocator_type local_682;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_681;
  anon_class_16_2_6acbd76d check;
  string root;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_650;
  string local_630 [32];
  string local_610 [32];
  string local_5f0 [32];
  string local_5d0 [32];
  string local_5b0 [32];
  string rawRoot;
  anon_class_40_2_d7075ad8 put;
  string type;
  string local_528;
  string local_508;
  string local_4e8;
  string local_4c8;
  string local_4a8;
  string local_488;
  string local_468;
  string local_448;
  string local_428;
  string local_408;
  string local_3e8;
  string local_3c8;
  string local_3a8;
  string local_388;
  string local_368;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  string local_308 [32];
  string local_2e8 [32];
  string local_2c8 [32];
  string local_2a8 [32];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_288;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_258;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_228;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1f8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1c8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_198;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_168;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_138;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_108;
  anon_class_40_2_d7075ad8 resolve;
  Arbiter a;
  
  arbiter::Arbiter::Arbiter(&a);
  pPVar3 = testing::
           WithParamInterface<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::GetParam(&(this->super_DriverTest).
                       super_TestWithParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       .
                       super_WithParamInterface<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     );
  std::__cxx11::string::string((string *)&rawRoot,(string *)pPVar3);
  std::__cxx11::string::string(local_2a8,(string *)&rawRoot);
  cVar1 = arbiter::Arbiter::isLocal(&a,local_2a8);
  if (cVar1 == '\0') {
    std::__cxx11::string::string((string *)&root,(string *)&rawRoot);
  }
  else {
    std::__cxx11::string::string(local_2c8,(string *)&rawRoot);
    arbiter::stripProtocol(&root,local_2c8);
    std::__cxx11::string::~string(local_2c8);
  }
  std::__cxx11::string::~string(local_2a8);
  std::__cxx11::string::string(local_2e8,(string *)&root);
  arbiter::getProtocol(&type,local_2e8);
  std::__cxx11::string::~string(local_2e8);
  bVar2 = std::operator==(&type,"http");
  if (!bVar2) {
    bVar2 = std::operator==(&type,"https");
    if (!bVar2) {
      put.a = &a;
      std::__cxx11::string::string((string *)&put.root,(string *)&root);
      std::__cxx11::string::string(local_308,(string *)&root);
      cVar1 = arbiter::Arbiter::isLocal(&a,local_308);
      std::__cxx11::string::~string(local_308);
      if (cVar1 != '\0') {
        std::operator+(&local_328,&root,"a");
        arbiter::mkdirp(&local_328);
        std::__cxx11::string::~string((string *)&local_328);
        std::operator+(&local_348,&root,"a/b");
        arbiter::mkdirp(&local_348);
        std::__cxx11::string::~string((string *)&local_348);
      }
      std::__cxx11::string::string((string *)&local_368,"one.txt",(allocator *)&local_650);
      TestBody::anon_class_40_2_d7075ad8::operator()(&put,&local_368);
      std::__cxx11::string::~string((string *)&local_368);
      std::__cxx11::string::string((string *)&local_388,"two.txt",(allocator *)&local_650);
      TestBody::anon_class_40_2_d7075ad8::operator()(&put,&local_388);
      std::__cxx11::string::~string((string *)&local_388);
      std::__cxx11::string::string((string *)&local_3a8,"a/one.txt",(allocator *)&local_650);
      TestBody::anon_class_40_2_d7075ad8::operator()(&put,&local_3a8);
      std::__cxx11::string::~string((string *)&local_3a8);
      std::__cxx11::string::string((string *)&local_3c8,"a/two.txt",(allocator *)&local_650);
      TestBody::anon_class_40_2_d7075ad8::operator()(&put,&local_3c8);
      std::__cxx11::string::~string((string *)&local_3c8);
      std::__cxx11::string::string((string *)&local_3e8,"a/b/one.txt",(allocator *)&local_650);
      TestBody::anon_class_40_2_d7075ad8::operator()(&put,&local_3e8);
      std::__cxx11::string::~string((string *)&local_3e8);
      std::__cxx11::string::string((string *)&local_408,"a/b/two.txt",(allocator *)&local_650);
      TestBody::anon_class_40_2_d7075ad8::operator()(&put,&local_408);
      std::__cxx11::string::~string((string *)&local_408);
      resolve.a = &a;
      std::__cxx11::string::string((string *)&resolve.root,(string *)&root);
      check.resolve = &resolve;
      check.root = &root;
      std::__cxx11::string::string((string *)&local_428,"*",&local_686);
      std::__cxx11::string::string((string *)&local_650,"one.txt",&local_687);
      std::__cxx11::string::string(local_630,"two.txt",&local_688);
      __l._M_len = 2;
      __l._M_array = &local_650;
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_108,__l,&local_689,&local_685);
      TestBody::anon_class_16_2_6acbd76d::operator()(&check,&local_428,(Paths *)&local_108);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&local_108);
      lVar4 = 0x20;
      do {
        std::__cxx11::string::~string((string *)((long)&local_650._M_dataplus._M_p + lVar4));
        lVar4 = lVar4 + -0x20;
      } while (lVar4 != -0x20);
      std::__cxx11::string::~string((string *)&local_428);
      std::__cxx11::string::string((string *)&local_448,"a/*",&local_686);
      std::__cxx11::string::string((string *)&local_650,"a/one.txt",&local_687);
      std::__cxx11::string::string(local_630,"a/two.txt",&local_688);
      __l_00._M_len = 2;
      __l_00._M_array = &local_650;
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_138,__l_00,&local_689,&local_685);
      TestBody::anon_class_16_2_6acbd76d::operator()(&check,&local_448,(Paths *)&local_138);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&local_138);
      lVar4 = 0x20;
      do {
        std::__cxx11::string::~string((string *)((long)&local_650._M_dataplus._M_p + lVar4));
        lVar4 = lVar4 + -0x20;
      } while (lVar4 != -0x20);
      std::__cxx11::string::~string((string *)&local_448);
      std::__cxx11::string::string((string *)&local_468,"a/b/*",&local_686);
      std::__cxx11::string::string((string *)&local_650,"a/b/one.txt",&local_687);
      std::__cxx11::string::string(local_630,"a/b/two.txt",&local_688);
      __l_01._M_len = 2;
      __l_01._M_array = &local_650;
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_168,__l_01,&local_689,&local_685);
      TestBody::anon_class_16_2_6acbd76d::operator()(&check,&local_468,(Paths *)&local_168);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&local_168);
      lVar4 = 0x20;
      do {
        std::__cxx11::string::~string((string *)((long)&local_650._M_dataplus._M_p + lVar4));
        lVar4 = lVar4 + -0x20;
      } while (lVar4 != -0x20);
      std::__cxx11::string::~string((string *)&local_468);
      std::__cxx11::string::string((string *)&local_488,"**",&local_686);
      std::__cxx11::string::string((string *)&local_650,"one.txt",&local_687);
      std::__cxx11::string::string(local_630,"two.txt",&local_688);
      std::__cxx11::string::string(local_610,"a/one.txt",(allocator *)&local_689);
      std::__cxx11::string::string(local_5f0,"a/two.txt",(allocator *)&local_685);
      std::__cxx11::string::string(local_5d0,"a/b/one.txt",&local_683);
      std::__cxx11::string::string(local_5b0,"a/b/two.txt",&local_684);
      __l_02._M_len = 6;
      __l_02._M_array = &local_650;
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_198,__l_02,&local_681,&local_682);
      TestBody::anon_class_16_2_6acbd76d::operator()(&check,&local_488,(Paths *)&local_198);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&local_198);
      lVar4 = 0xa0;
      do {
        std::__cxx11::string::~string((string *)((long)&local_650._M_dataplus._M_p + lVar4));
        lVar4 = lVar4 + -0x20;
      } while (lVar4 != -0x20);
      std::__cxx11::string::~string((string *)&local_488);
      std::__cxx11::string::string((string *)&local_4a8,"a/**",&local_686);
      std::__cxx11::string::string((string *)&local_650,"a/one.txt",&local_687);
      std::__cxx11::string::string(local_630,"a/two.txt",&local_688);
      std::__cxx11::string::string(local_610,"a/b/one.txt",(allocator *)&local_689);
      std::__cxx11::string::string(local_5f0,"a/b/two.txt",(allocator *)&local_685);
      __l_03._M_len = 4;
      __l_03._M_array = &local_650;
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_1c8,__l_03,
            (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_683,(allocator_type *)&local_684);
      TestBody::anon_class_16_2_6acbd76d::operator()(&check,&local_4a8,(Paths *)&local_1c8);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&local_1c8);
      lVar4 = 0x60;
      do {
        std::__cxx11::string::~string((string *)((long)&local_650._M_dataplus._M_p + lVar4));
        lVar4 = lVar4 + -0x20;
      } while (lVar4 != -0x20);
      std::__cxx11::string::~string((string *)&local_4a8);
      std::__cxx11::string::string((string *)&local_4c8,"a/b/**",&local_686);
      std::__cxx11::string::string((string *)&local_650,"a/b/one.txt",&local_687);
      std::__cxx11::string::string(local_630,"a/b/two.txt",&local_688);
      __l_04._M_len = 2;
      __l_04._M_array = &local_650;
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_1f8,__l_04,&local_689,&local_685);
      TestBody::anon_class_16_2_6acbd76d::operator()(&check,&local_4c8,(Paths *)&local_1f8);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&local_1f8);
      lVar4 = 0x20;
      do {
        std::__cxx11::string::~string((string *)((long)&local_650._M_dataplus._M_p + lVar4));
        lVar4 = lVar4 + -0x20;
      } while (lVar4 != -0x20);
      std::__cxx11::string::~string((string *)&local_4c8);
      std::__cxx11::string::string((string *)&local_4e8,"",&local_686);
      std::__cxx11::string::string((string *)&local_650,"",&local_687);
      __l_05._M_len = 1;
      __l_05._M_array = &local_650;
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_228,__l_05,
            (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_688,(allocator_type *)&local_689);
      TestBody::anon_class_16_2_6acbd76d::operator()(&check,&local_4e8,(Paths *)&local_228);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&local_228);
      std::__cxx11::string::~string((string *)&local_650);
      std::__cxx11::string::~string((string *)&local_4e8);
      std::__cxx11::string::string((string *)&local_508,"asdf",&local_686);
      std::__cxx11::string::string((string *)&local_650,"asdf",&local_687);
      __l_06._M_len = 1;
      __l_06._M_array = &local_650;
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_258,__l_06,
            (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_688,(allocator_type *)&local_689);
      TestBody::anon_class_16_2_6acbd76d::operator()(&check,&local_508,(Paths *)&local_258);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&local_258);
      std::__cxx11::string::~string((string *)&local_650);
      std::__cxx11::string::~string((string *)&local_508);
      std::__cxx11::string::string((string *)&local_528,"asdf.txt",&local_686);
      std::__cxx11::string::string((string *)&local_650,"asdf.txt",&local_687);
      __l_07._M_len = 1;
      __l_07._M_array = &local_650;
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_288,__l_07,
            (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_688,(allocator_type *)&local_689);
      TestBody::anon_class_16_2_6acbd76d::operator()(&check,&local_528,(Paths *)&local_288);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&local_288);
      std::__cxx11::string::~string((string *)&local_650);
      std::__cxx11::string::~string((string *)&local_528);
      std::__cxx11::string::~string((string *)&resolve.root);
      std::__cxx11::string::~string((string *)&put.root);
    }
  }
  std::__cxx11::string::~string((string *)&type);
  std::__cxx11::string::~string((string *)&root);
  std::__cxx11::string::~string((string *)&rawRoot);
  arbiter::Arbiter::~Arbiter(&a);
  return;
}

Assistant:

TEST_P(DriverTest, Glob)
{
    using Paths = std::set<std::string>;
    Arbiter a;

    const std::string rawRoot(GetParam());

    // Local directories explicitly prefixed with file:// will be returned
    // without that prefix, so strip that off.
    const std::string root(
            a.isLocal(rawRoot) ? stripProtocol(rawRoot) : rawRoot);
    const std::string type(getProtocol(root));

    // No `ls` for plain HTTP/s.
    if (type == "http" || type == "https") return;

    auto put([&a, root](std::string p)
    {
        EXPECT_NO_THROW(a.put(root + p, p));
    });

    if (a.isLocal(root))
    {
        mkdirp(root + "a");
        mkdirp(root + "a/b");
    }

    put("one.txt");
    put("two.txt");
    put("a/one.txt");
    put("a/two.txt");
    put("a/b/one.txt");
    put("a/b/two.txt");

    auto resolve([&a, root](std::string p)
    {
        const auto v = a.resolve(root + p);
        return Paths(v.begin(), v.end());
    });

    auto check([&](std::string p, Paths exp)
    {
        const auto got(resolve(p));
        EXPECT_GE(got.size(), exp.size());

        for (const auto& s : exp)
        {
            EXPECT_TRUE(got.count(root + s)) << p << ": " << root << s;
        }
    });

    // Non-recursive.
    check("*", Paths { "one.txt", "two.txt" });
    check("a/*", Paths { "a/one.txt", "a/two.txt" });
    check("a/b/*", Paths { "a/b/one.txt", "a/b/two.txt" });

    // Recursive.
    check("**", Paths {
            "one.txt", "two.txt",
            "a/one.txt", "a/two.txt",
            "a/b/one.txt", "a/b/two.txt"
        }
    );

    check("a/**", Paths {
            "a/one.txt", "a/two.txt",
            "a/b/one.txt", "a/b/two.txt"
        }
    );

    check("a/b/**", Paths { "a/b/one.txt", "a/b/two.txt" });

    // Not globs - files resolve to themselves.
    check("", Paths { "" });
    check("asdf", Paths { "asdf" });
    check("asdf.txt", Paths { "asdf.txt" });
}